

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O2

TestObject *
TestObject::Create(Recycler *recycler,int pointerCount,size_t extraBytes,CreateOptions options)

{
  bool bVar1;
  Recycler *alloc;
  TestObject *this;
  undefined4 *puVar2;
  code *pcVar3;
  type_info *_size;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  _size = (type_info *)(extraBytes + (long)pointerCount * 8 + 0x18);
  data.typeinfo = _size;
  if (options == LeafObj) {
    if (pointerCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar2 = 1;
      bVar1 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
                         ,0x97,"(pointerCount == 0)","pointerCount == 0");
      if (!bVar1) goto LAB_006bd92e;
      *puVar2 = 0;
    }
    local_50 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_274e31f;
    data.filename._0_4_ = 0x98;
    alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
    pcVar3 = Memory::Recycler::AllocLeaf;
  }
  else {
    if (options != NormalObj) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar2 = 1;
      bVar1 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
                         ,0x9c,"(false)","false");
      if (bVar1) {
        *puVar2 = 0;
        return (TestObject *)0x0;
      }
LAB_006bd92e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    local_50 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_274e31f;
    data.filename._0_4_ = 0x93;
    alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
    pcVar3 = Memory::Recycler::Alloc;
  }
  this = (TestObject *)new<Memory::Recycler>(0x18,alloc,(offset_in_Recycler_to_subr)pcVar3,0);
  TestObject(this,(size_t)_size,pointerCount);
  return this;
}

Assistant:

TestObject* TestObject::Create(Recycler *recycler, int pointerCount, size_t extraBytes, CreateOptions options)
{
    size_t size = sizeof(TestObject)+pointerCount * sizeof(TestObject*) + extraBytes;

    if (options == NormalObj)
    {
        return RecyclerNewPlus(recycler, size, TestObject, size, pointerCount);
    }
    else if (options == LeafObj)
    {
        Assert(pointerCount == 0);
        return RecyclerNewPlusLeaf(recycler, size, TestObject, size, pointerCount);
    }
    else
    {
        Assert(false);
        return nullptr;
    }
}